

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# last.cpp
# Opt level: O1

void copy_test(bool verbose)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  pstring astring;
  pstring string3;
  pstring string2;
  Framer framer;
  test_resource tpmr;
  char local_181;
  long *local_180;
  long local_178;
  long local_170 [2];
  test_resource *local_160;
  long local_158;
  char *local_150;
  long *local_148;
  long local_140;
  char *local_138;
  test_resource *local_130;
  long local_128;
  char *local_120;
  Framer local_118;
  test_resource local_110;
  
  Framer::Framer(&local_118,"copy constructor test",verbose);
  std::pmr::test_resource::test_resource(&local_110,"object",verbose);
  local_110.m_no_abort_flag_.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
  local_158 = 7;
  local_160 = &local_110;
  local_150 = (char *)(**(code **)(local_110._0_8_ + 0x10))(&local_110,8,1);
  builtin_strncpy(local_150,"barfool",8);
  local_128 = local_158;
  local_130 = &local_110;
  local_120 = (char *)(**(code **)(local_110._0_8_ + 0x10))(&local_110,local_158 + 1,1);
  strcpy(local_120,local_150);
  local_148 = (long *)std::pmr::get_default_resource();
  local_140 = local_158;
  local_138 = (char *)(**(code **)(*local_148 + 0x10))(local_148,local_158 + 1,1);
  strcpy(local_138,local_150);
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,local_150,local_150 + local_158);
  iVar1 = std::__cxx11::string::compare((char *)&local_180);
  if (local_180 != local_170) {
    operator_delete(local_180,local_170[0] + 1);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"astring.str()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"barfool\"",9);
    local_180 = (long *)CONCAT71(local_180._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_180,1);
    local_180 = local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,local_150,local_150 + local_158);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_180,local_178);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"barfool",7);
    local_181 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_181,1);
    if (local_180 != local_170) {
      operator_delete(local_180,local_170[0] + 1);
    }
    errorCount = errorCount + 1;
  }
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,local_120,local_120 + local_128);
  iVar1 = std::__cxx11::string::compare((char *)&local_180);
  if (local_180 != local_170) {
    operator_delete(local_180,local_170[0] + 1);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"string2.str()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"barfool\"",9);
    local_180 = (long *)CONCAT71(local_180._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_180,1);
    local_180 = local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,local_120,local_120 + local_128);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_180,local_178);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"barfool",7);
    local_181 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_181,1);
    if (local_180 != local_170) {
      operator_delete(local_180,local_170[0] + 1);
    }
    errorCount = errorCount + 1;
  }
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,local_138,local_138 + local_140);
  iVar1 = std::__cxx11::string::compare((char *)&local_180);
  if (local_180 != local_170) {
    operator_delete(local_180,local_170[0] + 1);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"string3.str()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"barfool\"",9);
    local_180 = (long *)CONCAT71(local_180._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_180,1);
    local_180 = local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,local_138,local_138 + local_140);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_180,local_178);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"barfool",7);
    local_181 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_181,1);
    if (local_180 != local_170) {
      operator_delete(local_180,local_170[0] + 1);
    }
    errorCount = errorCount + 1;
  }
  lVar3 = local_140 + 1;
  if (local_140 == 0) {
    lVar3 = 0;
  }
  (**(code **)(*local_148 + 0x18))(local_148,local_138,lVar3,1);
  lVar3 = local_128 + 1;
  if (local_128 == 0) {
    lVar3 = 0;
  }
  (**(code **)(*(long *)local_130 + 0x18))(local_130,local_120,lVar3,1);
  lVar3 = local_158 + 1;
  if (local_158 == 0) {
    lVar3 = 0;
  }
  (**(code **)(*(long *)local_160 + 0x18))(local_160,local_150,lVar3,1);
  std::pmr::test_resource::~test_resource(&local_110);
  Framer::~Framer(&local_118);
  return;
}

Assistant:

void copy_test(bool verbose)
{
    Framer framer{ "copy constructor test", verbose };

    std::pmr::test_resource tpmr{ "object", verbose };
    tpmr.set_no_abort(true);

    pstring astring{ "barfool", &tpmr };
    pstring string2{ astring, &tpmr };
    pstring string3{ astring };

    ASSERT_EQ(astring.str(), "barfool");
    ASSERT_EQ(string2.str(), "barfool");
    ASSERT_EQ(string3.str(), "barfool");
}